

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O3

int set_param_motor(void)

{
  int iVar1;
  long lVar2;
  ulong value64;
  char *format;
  char id;
  ulong uVar3;
  double dVar4;
  
  uVar3 = 0;
  do {
    if (g_param.motor_enable[uVar3] != 0) {
      id = (char)uVar3;
      if (g_P_changed[6][uVar3] != 0) {
        parameter_set('\x1a',id,(long)(g_P[6][uVar3] * 256.0));
      }
      if ((g_P_changed[7][uVar3] != 0) && (g_P_set[7][uVar3] != 0)) {
        parameter_set('#',id,(long)(g_P[7][uVar3] * 256.0));
      }
      if (g_P_changed[8][uVar3] != 0) {
        parameter_set('\x1e',id,(long)(g_P[8][uVar3] * 1000.0));
      }
      if (g_P_changed[0xd][uVar3] != 0) {
        parameter_set('\x19',id,(long)g_P[0xd][uVar3]);
      }
      if (((g_P_changed[0xe][uVar3] != 0) || (g_P_changed[0x40][uVar3] != 0)) ||
         (g_P_changed[4][uVar3] != 0)) {
        parameter_set('c',id,(long)(((g_P[4][uVar3] / g_P[0x40][uVar3]) * g_P[0xe][uVar3]) /
                                   6.283185307179586));
      }
      if (g_P_changed[5][uVar3] != 0) {
        parameter_set('\x1d',id,(long)g_P[5][uVar3]);
      }
      if (g_P_changed[0x3f][uVar3] != 0) {
        parameter_set('\x1f',id,(long)g_P[0x3f][uVar3]);
      }
      if (((g_P_changed[3][uVar3] != 0) || (g_P_changed[10][uVar3] != 0)) ||
         ((g_P_changed[1][uVar3] != 0 ||
          ((g_P_changed[0xb][uVar3] != 0 || (g_P_changed[6][uVar3] != 0)))))) {
        value64 = (ulong)((g_P[3][uVar3] * 65536.0 * g_P[10][uVar3] * g_P[0x40][uVar3]) /
                         (g_P[1][uVar3] * g_P[0xb][uVar3] * g_P[6][uVar3]));
        yprintf(OUTPUT_LV_DEBUG,"Info: TORQUE_CONSTANT[%d]: %d\n",uVar3 & 0xffffffff,
                value64 & 0xffffffff);
        if (value64 == 0) {
          yprintf(OUTPUT_LV_ERROR,"ERROR: TORQUE_CONSTANT[%d] fixed point value underflow\n",
                  uVar3 & 0xffffffff);
          yprintf(OUTPUT_LV_ERROR,"ERROR: Increase TORQUE_FINENESS[%d]\n",uVar3 & 0xffffffff);
          value64 = 0;
        }
        parameter_set('\x02',id,value64);
      }
      if ((((g_P_changed[3][uVar3] != 0) || (g_P_changed[0xc][uVar3] != 0)) ||
          (g_P_changed[4][uVar3] != 0)) ||
         ((g_P_changed[8][uVar3] != 0 || (g_P_changed[6][uVar3] != 0)))) {
        parameter_set('\x03',id,
                      (long)((g_P[3][uVar3] * 65536.0 * 60.0) /
                            (g_P[0xc][uVar3] * g_P[6][uVar3] * g_P[4][uVar3] * g_P[8][uVar3])));
      }
      if ((g_P_changed[0x21][uVar3] != 0) || (g_P_changed[1][uVar3] != 0)) {
        parameter_set('\x04',id,(long)(g_P[0x21][uVar3] * g_P[1][uVar3]));
      }
      if (g_P_set[0x23][uVar3] == 0) {
        lVar2 = 0x11de30;
        if (g_P_changed[0x21][uVar3] == 0) {
          iVar1 = g_P_changed[1][uVar3];
          lVar2 = 0x11de30;
          goto joined_r0x0010de21;
        }
LAB_0010de23:
        parameter_set('\x06',id,(long)(*(double *)(lVar2 + uVar3 * 8) * g_P[1][uVar3]));
      }
      else {
        lVar2 = 0x11df30;
        if (g_P_changed[0x23][uVar3] != 0) goto LAB_0010de23;
        iVar1 = g_P_changed[1][uVar3];
        lVar2 = 0x11df30;
joined_r0x0010de21:
        if (iVar1 != 0) goto LAB_0010de23;
      }
      if ((g_P_changed[4][uVar3] != 0) || (g_P_changed[8][uVar3] != 0)) {
        dVar4 = (6.283185307179586 / g_P[4][uVar3]) / g_P[8][uVar3];
        if ((g_P_changed[0x22][uVar3] != 0) || (g_P_changed[1][uVar3] != 0)) {
          parameter_set('\x05',id,(long)(g_P[0x22][uVar3] * g_P[1][uVar3] * dVar4));
        }
        if (g_P_set[0x23][uVar3] == 0) {
          lVar2 = 0x11deb0;
          if (g_P_changed[0x24][uVar3] == 0) {
            iVar1 = g_P_changed[1][uVar3];
            lVar2 = 0x11deb0;
            goto joined_r0x0010df0b;
          }
        }
        else {
          lVar2 = 0x11dfb0;
          if (g_P_changed[0x24][uVar3] == 0) {
            iVar1 = g_P_changed[1][uVar3];
            lVar2 = 0x11dfb0;
joined_r0x0010df0b:
            if (iVar1 == 0) goto LAB_0010df34;
          }
        }
        parameter_set('\a',id,(long)(dVar4 * *(double *)(lVar2 + uVar3 * 8) * g_P[1][uVar3]));
      }
LAB_0010df34:
      if ((g_P_changed[0x26][uVar3] != 0) || (g_P_changed[1][uVar3] != 0)) {
        parameter_set('\x16',id,(long)(g_P[0x26][uVar3] * g_P[1][uVar3]));
      }
      if ((g_P_changed[0x20][uVar3] != 0) || (g_P_changed[1][uVar3] != 0)) {
        parameter_set('\x12',id,(long)(g_P[0x20][uVar3] * g_P[1][uVar3]));
        parameter_set('\x13',id,(long)(-g_P[0x20][uVar3] * g_P[1][uVar3]));
      }
      if ((g_P_changed[0x27][uVar3] != 0) || (g_P_changed[1][uVar3] != 0)) {
        parameter_set('\x17',id,(long)(g_P[0x27][uVar3] * g_P[1][uVar3]));
      }
      if (g_P_changed[3][uVar3] != 0) {
        parameter_set('\x10',id,(long)g_P[3][uVar3]);
        parameter_set('\x11',id,(long)-g_P[3][uVar3]);
      }
      if (g_P_changed[4][uVar3] != 0) {
        parameter_set('\x18',id,(long)g_P[4][uVar3]);
      }
      if ((g_P_changed[0x40][uVar3] != 0) && (g_P_set[0x40][uVar3] != 0)) {
        if (g_param.device_version < 10) {
          format = "ERROR: the device doesn\'t support ENCODER_DENOMINATOR\n";
          goto LAB_0010e1d4;
        }
        parameter_set(' ',id,(long)g_P[0x40][uVar3]);
      }
      if (((g_P_changed[0x41][uVar3] != 0) || (g_P_changed[8][uVar3] != 0)) &&
         (g_P_set[0x41][uVar3] != 0)) {
        if (g_param.device_version < 0xb) {
          format = "ERROR: the device doesn\'t support HALL_DELAY\n";
          goto LAB_0010e1d4;
        }
        lVar2 = lroundf((float)(g_P[0x41][uVar3] / g_P[8][uVar3]) * 32768.0);
        parameter_set('!',id,lVar2);
      }
      if ((((g_P_changed[0x42][uVar3] != 0) || (g_P_changed[0x40][uVar3] != 0)) ||
          ((g_P_changed[4][uVar3] != 0 || (g_P_changed[8][uVar3] != 0)))) &&
         (g_P_set[0x42][uVar3] != 0)) {
        if (g_param.device_version < 0xb) {
          format = "ERROR: the device doesn\'t support LR_CUTOFF_FREQ\n";
LAB_0010e1d4:
          yprintf(OUTPUT_LV_ERROR,format);
          return 0;
        }
        lVar2 = lroundf((float)((g_P[0x42][uVar3] * g_P[8][uVar3] * g_P[4][uVar3]) /
                               g_P[0x40][uVar3]));
        parameter_set('\"',id,lVar2);
      }
      yp_usleep(20000);
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x10) {
      return 1;
    }
  } while( true );
}

Assistant:

int set_param_motor(void)
{
  int j;
  // モータのパラメータ
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (!g_param.motor_enable[j])
      continue;
    if (ischanged_p(YP_PARAM_VOLT, j))
    {
      parameter_set(PARAM_vsrc, j, g_P[YP_PARAM_VOLT][j] * 256);
    }
    if (ischanged_p(YP_PARAM_VOLT_MIN, j) && isset_p(YP_PARAM_VOLT_MIN, j))
    {
      parameter_set(PARAM_vmin, j, g_P[YP_PARAM_VOLT_MIN][j] * 256);
    }
    if (ischanged_p(YP_PARAM_CYCLE, j))
    {
      parameter_set(PARAM_control_cycle, j, g_P[YP_PARAM_CYCLE][j] * 1000);
    }
    if (ischanged_p(YP_PARAM_MOTOR_PHASE, j))
    {
      parameter_set(PARAM_motor_phase, j, g_P[YP_PARAM_MOTOR_PHASE][j]);
    }
    if (ischanged_p(YP_PARAM_PHASE_OFFSET, j) ||
        ischanged_p(YP_PARAM_ENCODER_DENOMINATOR, j) ||
        ischanged_p(YP_PARAM_COUNT_REV, j))
    {
      const double enc_rev_phase = g_P[YP_PARAM_COUNT_REV][j] / g_P[YP_PARAM_ENCODER_DENOMINATOR][j];
      parameter_set(PARAM_phase_offset, j,
                    g_P[YP_PARAM_PHASE_OFFSET][j] * enc_rev_phase / (2.0 * M_PI));
    }
    if (ischanged_p(YP_PARAM_ENCODER_TYPE, j))
    {
      parameter_set(PARAM_enc_type, j, g_P[YP_PARAM_ENCODER_TYPE][j]);
    }
    if (ischanged_p(YP_PARAM_ENCODER_DIV, j))
    {
      parameter_set(PARAM_enc_div, j, g_P[YP_PARAM_ENCODER_DIV][j]);
    }
    if (ischanged_p(YP_PARAM_PWM_MAX, j) ||
        ischanged_p(YP_PARAM_MOTOR_R, j) ||
        ischanged_p(YP_PARAM_TORQUE_UNIT, j) ||
        ischanged_p(YP_PARAM_MOTOR_TC, j) ||
        ischanged_p(YP_PARAM_VOLT, j))
    {
      // ki [pwmcnt/toqcnt] = (voltage unit [V/toqcnt]) * (PWM_MAX [pwmcnt]) / (VOLT [V])
      // voltage unit [V/toqcnt] = (current unit [A/toqcnt]) * (MOTOR_R [ohm])
      // current unit [A/toqcnt] = (1 [toqcnt]) / ((TORQUE_UNIT [toqcnt/Nm]) * (MOTOR_TC [Nm/A]))

      // ki [pwmcnt/toqcnt] = ((MOTOR_R [ohm]) * (PWM_MAX [pwmcnt])) / ((TORQUE_UNIT [toqcnt/Nm]) * (MOTOR_TC [Nm/A]) * (VOLT [V]))

      long long int ki;
      ki = (double)(65536.0 * g_P[YP_PARAM_PWM_MAX][j] * g_P[YP_PARAM_MOTOR_R][j] * g_P[YP_PARAM_ENCODER_DENOMINATOR][j] /
                    (g_P[YP_PARAM_TORQUE_UNIT][j] * g_P[YP_PARAM_MOTOR_TC][j] *
                     g_P[YP_PARAM_VOLT][j]));
      yprintf(OUTPUT_LV_DEBUG, "Info: TORQUE_CONSTANT[%d]: %d\n", j, (int)ki);
      if (ki == 0)
      {
        yprintf(OUTPUT_LV_ERROR, "ERROR: TORQUE_CONSTANT[%d] fixed point value underflow\n", j);
        yprintf(OUTPUT_LV_ERROR, "ERROR: Increase TORQUE_FINENESS[%d]\n", j);
      }
      parameter_set(PARAM_p_ki, j, ki);
    }

    if (ischanged_p(YP_PARAM_PWM_MAX, j) ||
        ischanged_p(YP_PARAM_MOTOR_VC, j) ||
        ischanged_p(YP_PARAM_COUNT_REV, j) ||
        ischanged_p(YP_PARAM_CYCLE, j) ||
        ischanged_p(YP_PARAM_VOLT, j))
    {
      // kv [(pwmcnt)/(cnt/ms)] = (vc native [V/(cnt/ms)]) * (PWM_MAX [pwmcnt]) / (VOLT [V])
      // vc native [V/(cnt/ms)] = (((60 [sec/min]) / (MOTOR_VC [(rev/min)/V]])) / (COUNT_REV [cnt/rev])) / (CYCLE [sec/ms])

      // kv [(pwmcnt)/(cnt/ms)] = ((60 [sec/min]) * (PWM_MAX [pwmcnt]))
      //                          / ((MOTOR_VC [(rev/min)/V]]) * (COUNT_REV [cnt/rev]) * (CYCLE [sec/ms]) * (VOLT [V]))

      parameter_set(PARAM_p_kv, j,
                    (double)(65536.0 * g_P[YP_PARAM_PWM_MAX][j] * 60.0 /
                             (g_P[YP_PARAM_MOTOR_VC][j] * g_P[YP_PARAM_VOLT][j] * g_P[YP_PARAM_COUNT_REV][j] *
                              g_P[YP_PARAM_CYCLE][j])));
    }

    // 摩擦補償
    if (ischanged_p(YP_PARAM_TORQUE_NEWTON, j) || ischanged_p(YP_PARAM_TORQUE_UNIT, j))
    {
      parameter_set(PARAM_p_fr_plus, j, g_P[YP_PARAM_TORQUE_NEWTON][j] * g_P[YP_PARAM_TORQUE_UNIT][j]);
    }

    if (g_P_set[YP_PARAM_TORQUE_NEWTON_NEG][j])
    {
      if (ischanged_p(YP_PARAM_TORQUE_NEWTON_NEG, j) || ischanged_p(YP_PARAM_TORQUE_UNIT, j))
      {
        parameter_set(PARAM_p_fr_minus, j, g_P[YP_PARAM_TORQUE_NEWTON_NEG][j] * g_P[YP_PARAM_TORQUE_UNIT][j]);
      }
    }
    else
    {
      if (ischanged_p(YP_PARAM_TORQUE_NEWTON, j) || ischanged_p(YP_PARAM_TORQUE_UNIT, j))
      {
        parameter_set(PARAM_p_fr_minus, j, g_P[YP_PARAM_TORQUE_NEWTON][j] * g_P[YP_PARAM_TORQUE_UNIT][j]);
      }
    }

    // cnt/ms -> rad/s = cnt/ms * ms/s * rad/cnt = cnt/ms * 2pi/COUNT_REV / CYCLE
    if (ischanged_p(YP_PARAM_COUNT_REV, j) ||
        ischanged_p(YP_PARAM_CYCLE, j))
    {
      const double tvc = (2.0 * M_PI / g_P[YP_PARAM_COUNT_REV][j]) / g_P[YP_PARAM_CYCLE][j];
      if (ischanged_p(YP_PARAM_TORQUE_VISCOS, j) || ischanged_p(YP_PARAM_TORQUE_UNIT, j))
      {
        parameter_set(PARAM_p_fr_wplus, j, g_P[YP_PARAM_TORQUE_VISCOS][j] * g_P[YP_PARAM_TORQUE_UNIT][j] * tvc);
      }
      if (g_P_set[YP_PARAM_TORQUE_NEWTON_NEG][j])
      {
        if (ischanged_p(YP_PARAM_TORQUE_VISCOS_NEG, j) || ischanged_p(YP_PARAM_TORQUE_UNIT, j))
        {
          parameter_set(PARAM_p_fr_wminus, j, g_P[YP_PARAM_TORQUE_VISCOS_NEG][j] * g_P[YP_PARAM_TORQUE_UNIT][j] * tvc);
        }
      }
      else
      {
        if (ischanged_p(YP_PARAM_TORQUE_VISCOS_NEG, j) || ischanged_p(YP_PARAM_TORQUE_UNIT, j))
        {
          parameter_set(PARAM_p_fr_wminus, j, g_P[YP_PARAM_TORQUE_VISCOS][j] * g_P[YP_PARAM_TORQUE_UNIT][j] * tvc);
        }
      }
    }

    if (ischanged_p(YP_PARAM_TORQUE_OFFSET, j) || ischanged_p(YP_PARAM_TORQUE_UNIT, j))
    {
      parameter_set(PARAM_p_toq_offset, j, g_P[YP_PARAM_TORQUE_OFFSET][j] * g_P[YP_PARAM_TORQUE_UNIT][j]);
    }

    if (ischanged_p(YP_PARAM_TORQUE_MAX, j) || ischanged_p(YP_PARAM_TORQUE_UNIT, j))
    {
      parameter_set(PARAM_toq_max, j, g_P[YP_PARAM_TORQUE_MAX][j] * g_P[YP_PARAM_TORQUE_UNIT][j]);
      parameter_set(PARAM_toq_min, j, -g_P[YP_PARAM_TORQUE_MAX][j] * g_P[YP_PARAM_TORQUE_UNIT][j]);
    }

    if (ischanged_p(YP_PARAM_TORQUE_LIMIT, j) || ischanged_p(YP_PARAM_TORQUE_UNIT, j))
    {
      parameter_set(PARAM_toq_limit, j, g_P[YP_PARAM_TORQUE_LIMIT][j] * g_P[YP_PARAM_TORQUE_UNIT][j]);
    }

    if (ischanged_p(YP_PARAM_PWM_MAX, j))
    {
      parameter_set(PARAM_pwm_max, j, g_P[YP_PARAM_PWM_MAX][j]);
      parameter_set(PARAM_pwm_min, j, -g_P[YP_PARAM_PWM_MAX][j]);
    }

    if (ischanged_p(YP_PARAM_COUNT_REV, j))
    {
      parameter_set(PARAM_enc_rev, j, g_P[YP_PARAM_COUNT_REV][j]);
    }
    if (ischanged_p(YP_PARAM_ENCODER_DENOMINATOR, j) &&
        isset_p(YP_PARAM_ENCODER_DENOMINATOR, j))
    {
      if (g_param.device_version < 10)
      {
        yprintf(OUTPUT_LV_ERROR, "ERROR: the device doesn't support ENCODER_DENOMINATOR\n");
        return 0;
      }
      parameter_set(PARAM_enc_denominator, j, g_P[YP_PARAM_ENCODER_DENOMINATOR][j]);
    }
    if (ischanged_p(YP_PARAM_HALL_DELAY, j) ||
        ischanged_p(YP_PARAM_CYCLE, j))
    {
      if (isset_p(YP_PARAM_HALL_DELAY, j))
      {
        if (g_param.device_version < 11)
        {
          yprintf(OUTPUT_LV_ERROR, "ERROR: the device doesn't support HALL_DELAY\n");
          return 0;
        }
        const float delay_factor = g_P[YP_PARAM_HALL_DELAY][j] / g_P[YP_PARAM_CYCLE][j];
        parameter_set(PARAM_hall_delay_factor, j, lroundf(32768.0 * delay_factor));
      }
    }
    if (ischanged_p(YP_PARAM_LR_CUTOFF_FREQ, j) ||
        ischanged_p(YP_PARAM_ENCODER_DENOMINATOR, j) ||
        ischanged_p(YP_PARAM_COUNT_REV, j) ||
        ischanged_p(YP_PARAM_CYCLE, j))
    {
      if (isset_p(YP_PARAM_LR_CUTOFF_FREQ, j))
      {
        if (g_param.device_version < 11)
        {
          yprintf(OUTPUT_LV_ERROR, "ERROR: the device doesn't support LR_CUTOFF_FREQ\n");
          return 0;
        }
        const float cutoff_vel =
            g_P[YP_PARAM_LR_CUTOFF_FREQ][j] * g_P[YP_PARAM_CYCLE][j] *
            g_P[YP_PARAM_COUNT_REV][j] / g_P[YP_PARAM_ENCODER_DENOMINATOR][j];
        parameter_set(PARAM_lr_cutoff_vel, j, lroundf(cutoff_vel));
      }
    }

    // Sleep to keep bandwidth margin
    yp_usleep(20000);
  }
  return 1;
}